

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O1

vector<CKeyID,_std::allocator<CKeyID>_> * __thiscall
XOnlyPubKey::GetKeyIDs
          (vector<CKeyID,_std::allocator<CKeyID>_> *__return_storage_ptr__,XOnlyPubKey *this)

{
  pointer *ppCVar1;
  iterator iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  CPubKey fullpubkey;
  uchar b [33];
  CKeyID local_9d;
  CPubKey local_89;
  uchar local_48;
  undefined7 uStack_47;
  undefined1 uStack_40;
  undefined7 uStack_3f;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined1 uStack_30;
  undefined7 uStack_2f;
  undefined1 local_28;
  uchar local_27 [7];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = '\x02';
  uVar3 = *(undefined8 *)(this->m_keydata).super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((this->m_keydata).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)((this->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar6 = *(undefined8 *)((this->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x18);
  uStack_47 = (undefined7)uVar3;
  uStack_40 = (undefined1)((ulong)uVar3 >> 0x38);
  uStack_3f = (undefined7)uVar4;
  local_38 = (undefined1)((ulong)uVar4 >> 0x38);
  uStack_37 = (undefined7)uVar5;
  uStack_30 = (undefined1)((ulong)uVar5 >> 0x38);
  uStack_2f = (undefined7)uVar6;
  local_28 = (undefined1)((ulong)uVar6 >> 0x38);
  local_89.vch[0] = 0xff;
  CPubKey::Set<unsigned_char*>(&local_89,&local_48,local_27);
  CPubKey::GetID(&local_9d,&local_89);
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<CKeyID,_std::allocator<CKeyID>_>::_M_realloc_insert<CKeyID>
              (__return_storage_ptr__,iVar2,&local_9d);
  }
  else {
    *(undefined4 *)
     (((iVar2._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10) =
         local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._16_4_;
    *(ulong *)((iVar2._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems =
         CONCAT44(local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._4_4_,
                  local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_);
    *(ulong *)(((iVar2._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 8) =
         CONCAT44(local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._12_4_,
                  local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._8_4_);
    ppCVar1 = &(__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  local_48 = '\x03';
  CPubKey::Set<unsigned_char*>(&local_89,&local_48,local_27);
  CPubKey::GetID(&local_9d,&local_89);
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<CKeyID,_std::allocator<CKeyID>_>::_M_realloc_insert<CKeyID>
              (__return_storage_ptr__,iVar2,&local_9d);
  }
  else {
    *(undefined4 *)
     (((iVar2._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10) =
         local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._16_4_;
    *(undefined4 *)((iVar2._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems =
         local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_;
    *(undefined4 *)(((iVar2._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 4) =
         local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._4_4_;
    *(undefined4 *)(((iVar2._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 8) =
         local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._8_4_;
    *(undefined4 *)(((iVar2._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 0xc)
         = local_9d.super_uint160.super_base_blob<160U>.m_data._M_elems._12_4_;
    ppCVar1 = &(__return_storage_ptr__->super__Vector_base<CKeyID,_std::allocator<CKeyID>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CKeyID> XOnlyPubKey::GetKeyIDs() const
{
    std::vector<CKeyID> out;
    // For now, use the old full pubkey-based key derivation logic. As it is indexed by
    // Hash160(full pubkey), we need to return both a version prefixed with 0x02, and one
    // with 0x03.
    unsigned char b[33] = {0x02};
    std::copy(m_keydata.begin(), m_keydata.end(), b + 1);
    CPubKey fullpubkey;
    fullpubkey.Set(b, b + 33);
    out.push_back(fullpubkey.GetID());
    b[0] = 0x03;
    fullpubkey.Set(b, b + 33);
    out.push_back(fullpubkey.GetID());
    return out;
}